

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_endpointer.c
# Opt level: O2

int16 * ps_endpointer_end_stream(ps_endpointer_t *ep,int16 *frame,size_t nsamp,size_t *out_nsamp)

{
  int iVar1;
  undefined8 in_RAX;
  void *__dest;
  void *__dest_00;
  int16 *piVar2;
  undefined1 auVar3 [16];
  undefined8 uStack_38;
  int is_speech;
  
  iVar1 = ep->frame_size;
  if ((ulong)(long)iVar1 < nsamp) {
    piVar2 = (int16 *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
            ,0xf1,"Final frame must be %d samples or less\n");
  }
  else {
    if (out_nsamp != (size_t *)0x0) {
      *out_nsamp = 0;
    }
    if (ep->in_speech == 0) {
      piVar2 = (int16 *)0x0;
    }
    else {
      ep->in_speech = 0;
      ep->speech_end = ep->qstart_time;
      uStack_38 = in_RAX;
      if (ep->pos != 0) {
        __dest = __ckd_calloc__(2,(long)(ep->pos * iVar1),
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                                ,0xd0);
        __dest_00 = __ckd_calloc__(1,(long)ep->pos,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                                   ,0xd1);
        memcpy(__dest,ep->buf,(long)ep->frame_size * (long)ep->pos * 2);
        memcpy(__dest_00,ep->is_speech,(long)ep->pos);
        memmove(ep->buf,ep->buf + (long)ep->frame_size * (long)ep->pos,
                ((long)ep->maxlen - (long)ep->pos) * (long)ep->frame_size * 2);
        memmove(ep->is_speech,ep->is_speech + ep->pos,(long)ep->maxlen - (long)ep->pos);
        memcpy(ep->buf + ((long)ep->maxlen - (long)ep->pos) * (long)ep->frame_size,__dest,
               (long)ep->pos * (long)ep->frame_size * 2);
        memcpy(ep->is_speech + ((long)ep->maxlen - (long)ep->pos),__dest_00,(long)ep->pos);
        ep->pos = 0;
        ckd_free(__dest);
        ckd_free(__dest_00);
        if (ep->pos != 0) {
          __assert_fail("ep->pos == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                        ,0xfe,
                        "const int16 *ps_endpointer_end_stream(ps_endpointer_t *, const int16 *, size_t, size_t *)"
                       );
        }
      }
      while (ep->n != 0) {
        ep_pop(ep,&is_speech);
        if (is_speech == 0) {
          if (ep->n != 0) goto LAB_0010da0f;
          break;
        }
        if (out_nsamp != (size_t *)0x0) {
          *out_nsamp = *out_nsamp + (long)ep->frame_size;
        }
        ep->speech_end = ep->qstart_time;
      }
      if ((ep->speech_end == ep->qstart_time) && (!NAN(ep->speech_end) && !NAN(ep->qstart_time))) {
        if (ep->pos == ep->maxlen) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                  ,0x10d,"VAD queue overflow (should not happen)");
        }
        else {
          iVar1 = ps_vad_sample_rate(ep->vad);
          auVar3._8_4_ = (int)(nsamp >> 0x20);
          auVar3._0_8_ = nsamp;
          auVar3._12_4_ = 0x45300000;
          ep->timestamp =
               ((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)nsamp) - 4503599627370496.0)) / (double)iVar1 +
               ep->timestamp;
          if (out_nsamp != (size_t *)0x0) {
            *out_nsamp = *out_nsamp + nsamp;
          }
          memcpy(ep->buf + (long)ep->frame_size * (long)ep->pos,frame,nsamp * 2);
          ep->speech_end = ep->timestamp;
        }
      }
LAB_0010da0f:
      ep->n = 0;
      piVar2 = ep->buf;
    }
  }
  return piVar2;
}

Assistant:

const int16 *
ps_endpointer_end_stream(ps_endpointer_t *ep,
                         const int16 *frame,
                         size_t nsamp,
                         size_t *out_nsamp)
{
    if (nsamp > (size_t)ep->frame_size) {
        E_ERROR("Final frame must be %d samples or less\n",
                ep->frame_size);
        return NULL;
    }
    
    if (out_nsamp)
        *out_nsamp = 0;
    if (!ep->in_speech)
        return NULL;
    ep->in_speech = FALSE;
    ep->speech_end = ep->qstart_time;

    /* Rotate the buffer so we can return data in a single call. */
    ep_linearize(ep);
    assert(ep->pos == 0);
    while (!ep_empty(ep)) {
        int is_speech;
        ep_pop(ep, &is_speech);
        if (is_speech) {
            if (out_nsamp)
                *out_nsamp += ep->frame_size;
            ep->speech_end = ep->qstart_time;
        }
        else
            break;
    }
    /* If we used all the VAD queue, add the trailing samples. */
    if (ep_empty(ep) && ep->speech_end == ep->qstart_time) {
        if (ep->pos == ep->maxlen) {
            E_ERROR("VAD queue overflow (should not happen)");
            /* Not fatal, we just lose data. */
        }
        else {
            ep->timestamp +=
                (double)nsamp / ps_endpointer_sample_rate(ep);
            if (out_nsamp)
                *out_nsamp += nsamp;
            memcpy(ep->buf + ep->pos * ep->frame_size,
                   frame, nsamp * sizeof(*ep->buf));
            ep->speech_end = ep->timestamp;
        }
    }
    ep_clear(ep);
    return ep->buf;
}